

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_alloc_path_table(archive_write *a,vdd *vdd,int max_depth)

{
  void *pvVar1;
  undefined4 in_EDX;
  long in_RSI;
  archive *in_RDI;
  int i;
  int local_20;
  int local_4;
  
  *(undefined4 *)(in_RSI + 0x18) = in_EDX;
  pvVar1 = malloc((long)*(int *)(in_RSI + 0x18) << 5);
  *(void **)(in_RSI + 0x10) = pvVar1;
  if (*(long *)(in_RSI + 0x10) == 0) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
    local_4 = -0x1e;
  }
  else {
    for (local_20 = 0; local_20 < *(int *)(in_RSI + 0x18); local_20 = local_20 + 1) {
      *(undefined8 *)(*(long *)(in_RSI + 0x10) + (long)local_20 * 0x20) = 0;
      *(long *)(*(long *)(in_RSI + 0x10) + (long)local_20 * 0x20 + 8) =
           *(long *)(in_RSI + 0x10) + (long)local_20 * 0x20;
      *(undefined8 *)(*(long *)(in_RSI + 0x10) + (long)local_20 * 0x20 + 0x10) = 0;
      *(undefined4 *)(*(long *)(in_RSI + 0x10) + (long)local_20 * 0x20 + 0x18) = 0;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
isoent_alloc_path_table(struct archive_write *a, struct vdd *vdd,
    int max_depth)
{
	int i;

	vdd->max_depth = max_depth;
	vdd->pathtbl = malloc(sizeof(*vdd->pathtbl) * vdd->max_depth);
	if (vdd->pathtbl == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	for (i = 0; i < vdd->max_depth; i++) {
		vdd->pathtbl[i].first = NULL;
		vdd->pathtbl[i].last = &(vdd->pathtbl[i].first);
		vdd->pathtbl[i].sorted = NULL;
		vdd->pathtbl[i].cnt = 0;
	}
	return (ARCHIVE_OK);
}